

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

int errParseTest(char *filename,char *result,char *err,int options)

{
  int iVar1;
  char *local_58;
  xmlChar *base;
  xmlXIncludeCtxtPtr xinc;
  int local_40;
  int ret;
  int res;
  int size;
  xmlDocPtr doc;
  xmlParserCtxtPtr ctxt;
  char *pcStack_20;
  int options_local;
  char *err_local;
  char *result_local;
  char *filename_local;
  
  local_40 = 0;
  xinc._4_4_ = 0;
  nb_tests = nb_tests + 1;
  ctxt._4_4_ = options;
  pcStack_20 = err;
  err_local = result;
  result_local = filename;
  if ((options & 0x40000000U) == 0) {
    doc = (xmlDocPtr)xmlNewParserCtxt();
    xmlCtxtSetErrorHandler(doc,testStructuredErrorHandler,0);
    _res = (xmlDocPtr)xmlCtxtReadFile(doc,result_local,0,ctxt._4_4_);
    if ((ctxt._4_4_ & 0x400) != 0) {
      base = (xmlChar *)0x0;
      base = (xmlChar *)xmlXIncludeNewContext(_res);
      xmlXIncludeSetErrorHandler(base,testStructuredErrorHandler,0);
      xmlXIncludeSetFlags(base,ctxt._4_4_);
      iVar1 = xmlXIncludeProcessNode(base,_res);
      if (iVar1 < 0) {
        testErrorHandler((void *)0x0,"%s : failed to parse\n",result_local);
        xmlFreeDoc(_res);
        _res = (xmlDocPtr)0x0;
      }
      xmlXIncludeFreeContext(base);
    }
  }
  else {
    doc = (xmlDocPtr)htmlNewParserCtxt();
    xmlCtxtSetErrorHandler(doc,testStructuredErrorHandler,0);
    _res = (xmlDocPtr)htmlCtxtReadFile(doc,result_local,0,ctxt._4_4_);
  }
  if (err_local != (char *)0x0) {
    local_58 = (char *)0x0;
    if (_res == (xmlDocPtr)0x0) {
      local_58 = (char *)xmlStrdup("");
      ret = 0;
    }
    else if ((ctxt._4_4_ & 0x40000000) == 0) {
      xmlDocDumpMemory(_res,&local_58,&ret);
    }
    else {
      htmlDocDumpMemory(_res,&local_58,&ret);
    }
    local_40 = compareFileMem(err_local,local_58,ret);
    (*_xmlFree)(local_58);
  }
  if (local_40 == 0) {
    if (pcStack_20 == (char *)0x0) {
      if (((ctxt._4_4_ & 0x10) != 0) && (testErrorsSize != 0)) {
        fprintf(_stderr,"Validation for %s failed\n",result_local);
        xinc._4_4_ = -1;
      }
    }
    else {
      local_40 = compareFileMem(pcStack_20,testErrors,testErrorsSize);
      if (local_40 != 0) {
        fprintf(_stderr,"Error for %s failed\n",result_local);
        xinc._4_4_ = -1;
      }
    }
  }
  else {
    fprintf(_stderr,"Result for %s failed in %s\n",result_local,err_local);
    xinc._4_4_ = -1;
  }
  iVar1 = testParseContent((xmlParserCtxtPtr)doc,_res,result_local);
  if (iVar1 < 0) {
    xinc._4_4_ = -1;
  }
  xmlFreeDoc(_res);
  xmlFreeParserCtxt(doc);
  return xinc._4_4_;
}

Assistant:

static int
errParseTest(const char *filename, const char *result, const char *err,
             int options) {
    xmlParserCtxtPtr ctxt;
    xmlDocPtr doc;
    int size, res = 0;
    int ret = 0;

    nb_tests++;
#ifdef LIBXML_HTML_ENABLED
    if (options & XML_PARSE_HTML) {
        ctxt = htmlNewParserCtxt();
        xmlCtxtSetErrorHandler(ctxt, testStructuredErrorHandler, NULL);
        doc = htmlCtxtReadFile(ctxt, filename, NULL, options);
    } else
#endif
    {
        ctxt = xmlNewParserCtxt();
        xmlCtxtSetErrorHandler(ctxt, testStructuredErrorHandler, NULL);
	doc = xmlCtxtReadFile(ctxt, filename, NULL, options);
#ifdef LIBXML_XINCLUDE_ENABLED
        if (options & XML_PARSE_XINCLUDE) {
            xmlXIncludeCtxtPtr xinc = NULL;

            xinc = xmlXIncludeNewContext(doc);
            xmlXIncludeSetErrorHandler(xinc, testStructuredErrorHandler, NULL);
            xmlXIncludeSetFlags(xinc, options);
            if (xmlXIncludeProcessNode(xinc, (xmlNodePtr) doc) < 0) {
                testErrorHandler(NULL, "%s : failed to parse\n", filename);
                xmlFreeDoc(doc);
                doc = NULL;
            }
            xmlXIncludeFreeContext(xinc);
        }
#endif
    }
    if (result) {
        xmlChar *base = NULL;

	if (doc == NULL) {
	    base = xmlStrdup(BAD_CAST "");
	    size = 0;
	} else {
#ifdef LIBXML_HTML_ENABLED
	    if (options & XML_PARSE_HTML) {
		htmlDocDumpMemory(doc, &base, &size);
	    } else
#endif
	    xmlDocDumpMemory(doc, &base, &size);
	}
	res = compareFileMem(result, (char *) base, size);
	xmlFree(base);
    }

    if (res != 0) {
        fprintf(stderr, "Result for %s failed in %s\n", filename, result);
        ret = -1;
    } else if (err != NULL) {
	res = compareFileMem(err, testErrors, testErrorsSize);
	if (res != 0) {
	    fprintf(stderr, "Error for %s failed\n", filename);
	    ret = -1;
	}
    } else if (options & XML_PARSE_DTDVALID) {
        if (testErrorsSize != 0) {
	    fprintf(stderr, "Validation for %s failed\n", filename);
            ret = -1;
        }
    }

    if (testParseContent(ctxt, doc, filename) < 0)
	ret = -1;

    xmlFreeDoc(doc);
    xmlFreeParserCtxt(ctxt);
    return(ret);
}